

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

bool read_file(string *path,string *output)

{
  uint uVar1;
  pointer pcVar2;
  undefined8 in_R9;
  ifstream ifs;
  long local_220 [4];
  uint auStack_200 [50];
  undefined8 auStack_138 [36];
  
  std::ifstream::ifstream(local_220,(string *)path,_S_in);
  uVar1 = *(uint *)((long)auStack_200 + *(long *)(local_220[0] + -0x18));
  if ((uVar1 & 5) == 0) {
    std::istream::seekg((long)local_220,_S_beg);
    std::istream::tellg();
    std::__cxx11::string::reserve((ulong)output);
    std::istream::seekg((long)local_220,_S_beg);
    pcVar2 = (output->_M_dataplus)._M_p;
    std::__cxx11::string::_M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)output,pcVar2,pcVar2 + output->_M_string_length,
               *(undefined8 *)((long)auStack_138 + *(long *)(local_220[0] + -0x18)),0xffffffff,in_R9
               ,0,0xffffffff);
  }
  std::ifstream::~ifstream(local_220);
  return (uVar1 & 5) == 0;
}

Assistant:

bool read_file(const std::string& path, std::string& output) {
  std::ifstream ifs(path);
  if(!ifs) {
    return false;
  }

  ifs.seekg(0, std::ios::end);
  output.reserve(ifs.tellg());
  ifs.seekg(0, std::ios::beg);

  output.assign((std::istreambuf_iterator<char>(ifs)), std::istreambuf_iterator<char>());
  return true;
}